

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cpp
# Opt level: O3

void __thiscall
duckdb::FileHandle::FileHandle
          (FileHandle *this,FileSystem *file_system,string *path_p,FileOpenFlags flags)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  
  uVar5 = flags._8_8_;
  this->_vptr_FileHandle = (_func_int **)&PTR__FileHandle_01968710;
  this->file_system = file_system;
  paVar1 = &(this->path).field_2;
  (this->path)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (path_p->_M_dataplus)._M_p;
  paVar2 = &path_p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&path_p->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->path).field_2 + 8) = uVar4;
  }
  else {
    (this->path)._M_dataplus._M_p = pcVar3;
    (this->path).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->path)._M_string_length = path_p->_M_string_length;
  (path_p->_M_dataplus)._M_p = (pointer)paVar2;
  path_p->_M_string_length = 0;
  (path_p->field_2)._M_local_buf[0] = '\0';
  (this->flags).flags = flags.flags;
  (this->flags).lock = (char)uVar5;
  (this->flags).compression = (char)((ulong)uVar5 >> 8);
  *(int6 *)&(this->flags).field_0xa = (int6)((ulong)uVar5 >> 0x10);
  return;
}

Assistant:

FileHandle::FileHandle(FileSystem &file_system, string path_p, FileOpenFlags flags)
    : file_system(file_system), path(std::move(path_p)), flags(flags) {
}